

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::DeleteProperty
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,JavascriptString *propertyNameString,
          PropertyOperationFlags propertyOperationFlags)

{
  byte bVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  uint uVar4;
  ScriptContext *this_00;
  DynamicObject *pDVar5;
  bool bVar6;
  charcount_t cVar7;
  int iVar8;
  PropertyId propertyId;
  BOOL BVar9;
  undefined4 *puVar10;
  char16 *pcVar11;
  Type *pTVar12;
  undefined4 extraout_var;
  RecyclableObject *pRVar13;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *this_01;
  byte bVar14;
  char16_t *form;
  CharacterBuffer<char16_t> local_68;
  RecyclableObject *local_58;
  ScriptContext *local_50;
  SimpleDictionaryPropertyDescriptor<int> *local_48;
  DynamicObject *local_40;
  PropertyOperationFlags local_34;
  
  local_34 = propertyOperationFlags;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    pcVar11 = JavascriptString::GetString(propertyNameString);
    cVar7 = JavascriptString::GetLength(propertyNameString);
    bVar6 = PropertyRecord::IsPropertyNameNumeric(pcVar11,cVar7);
    if (bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x617,
                                  "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                  ,
                                  "Numeric property names should have been converted to uint or PropertyRecord* "
                                 );
      if (!bVar6) goto LAB_00c6f735;
      *puVar10 = 0;
    }
    bVar1 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)this)->
            super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
            super_DynamicTypeHandler.flags;
    if ((bVar1 & 4) == 0) break;
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
  }
  pTVar12 = (instance->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar12[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar1 & 0x10) != 0) || (*(char *)((long)&pTVar12[1].javascriptLibrary.ptr + 1) == '\x01'))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x627,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar6) goto LAB_00c6f735;
      *puVar10 = 0;
    }
    DynamicObject::ChangeType(instance);
    pTVar12 = (instance->super_RecyclableObject).type.ptr;
  }
  local_50 = (((pTVar12->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  local_58 = (RecyclableObject *)JavascriptString::GetString(propertyNameString);
  cVar7 = JavascriptString::GetLength(propertyNameString);
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet(&local_68.string,(char16_t *)local_58);
  local_68.len = cVar7;
  bVar6 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)(((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *
                          )this)->
                        super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
                        propertyMap.ptr,&local_68,&local_48);
  if (!bVar6) {
    return 1;
  }
  bVar1 = local_48->Attributes;
  if ((bVar1 & 8) != 0) {
    return 1;
  }
  if ((bVar1 & 2) == 0) {
    pcVar11 = JavascriptString::GetString(propertyNameString);
    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(local_34,local_50,pcVar11);
    return 0;
  }
  local_40 = instance;
  if ((bVar1 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x643,"(!(descriptor->Attributes & 0x10))",
                                "!(descriptor->Attributes & PropertyLetConstGlobal)");
    if (!bVar6) goto LAB_00c6f735;
    *puVar10 = 0;
  }
  pDVar5 = local_40;
  uVar4 = DAT_0145c358;
  if (local_48->propertyIndex == -1) {
LAB_00c6f66a:
    pDVar5 = local_40;
    local_48->Attributes = '\x0e';
    if ((char)((local_40->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(local_40);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,pDVar5,&local_68,(Var)0x0,SideEffects_Any);
    return 1;
  }
  pRVar13 = (((local_50->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
  bVar1 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)this)->
          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).field_0x28;
  if (((int)DAT_0145c358 < 1 || (bVar1 & 2) != 0) ||
     (bVar14 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)this)->
               super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
               numDeletedProperties + 1,
     (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)this)->
     super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).numDeletedProperties
          = bVar14, bVar14 < uVar4)) {
    pRVar2 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)this)->
             super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
             singletonInstance.ptr;
    local_58 = pRVar13;
    if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != local_40)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x66f,
                                  "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                  ,
                                  "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                 );
      if (!bVar6) {
LAB_00c6f735:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
    InvalidateFixedField<Js::JavascriptString*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this,
               propertyNameString,local_48,
               (((((local_40->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
    if (((((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)this)->
         super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
         super_DynamicTypeHandler.flags & 0x20) != 0) {
      iVar8 = (*(propertyNameString->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(propertyNameString)
      ;
      cVar7 = JavascriptString::GetLength(propertyNameString);
      this_00 = local_50;
      propertyId = ScriptContext::GetOrAddPropertyIdTracked
                             (local_50,(LPCWSTR)CONCAT44(extraout_var,iVar8),cVar7);
      ScriptContext::InvalidateProtoCaches(this_00,propertyId);
    }
    if ((((((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)this)->
          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).field_0x28 & 2)
         == 0) ||
       (bVar6 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true>::
                TryRegisterDeletedPropertyIndex
                          ((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true>
                            *)this,local_40,local_48->propertyIndex), !bVar6)) {
      DynamicTypeHandler::SetSlotUnchecked(local_40,local_48->propertyIndex,local_58);
    }
    goto LAB_00c6f66a;
  }
  if (((bVar1 & 4) == 0) &&
     (pRVar13 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                          (&local_40->super_RecyclableObject,(RecyclableObject **)0x0),
     pRVar13 == (RecyclableObject *)0x0)) {
    bVar6 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
    if (!bVar6) goto LAB_00c6f6f2;
    form = L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n";
  }
  else {
    bVar6 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
    if (!bVar6) goto LAB_00c6f6f2;
    form = L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n";
  }
  Output::Print(form);
  Output::Flush();
LAB_00c6f6f2:
  this_01 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
            ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>
                      ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this,
                       pDVar5);
  BVar9 = DeleteProperty(&this_01->
                          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>,
                         pDVar5,propertyNameString,local_34);
  return BVar9;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty(DynamicObject* instance, JavascriptString* propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* ");

        if (!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();

            JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            if (propertyMap->TryGetReference(propertyName, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted)
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyNameString->GetString()); // or propertyName->GetBuffer

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyNameString, descriptor, instance->GetScriptContext());
#endif
                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(scriptContext->GetOrAddPropertyIdTracked(propertyNameString->GetSz(), propertyNameString->GetLength()));
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if (!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyName, nullptr, SideEffects_Any);
                return true;
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
        }
        return true;
    }